

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

void __thiscall xemmai::t_slot::t_slot(t_slot *this,t_object *a_p)

{
  t_queue<128UL> *this_00;
  undefined8 *puVar1;
  t_object *a_p_local;
  t_slot *this_local;
  
  std::atomic<xemmai::t_object_*>::atomic(&this->v_p,a_p);
  if ((t_object *)0x4 < a_p) {
    puVar1 = (undefined8 *)__tls_get_addr(&PTR_00128de8);
    this_00 = (t_queue<128UL> *)*puVar1;
    *this_00->v_head = a_p;
    if (this_00->v_head == this_00->v_next) {
      t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  return;
}

Assistant:

t_slot(t_object* a_p = nullptr) : v_p(a_p)
	{
		if (reinterpret_cast<uintptr_t>(a_p) >= c_tag__OBJECT) t_increments::f_push(a_p);
	}